

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RunVmPass(ExpressionContext *ctx,VmModule *module,VmPassType type)

{
  char *pcVar1;
  ExpressionContext *function;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ExpressionContext *ctx_00;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  TraceScope traceScope;
  
  if ((RunVmPass(ExpressionContext&,VmModule*,VmPassType)::token == '\0') &&
     (iVar4 = __cxa_guard_acquire(&RunVmPass(ExpressionContext&,VmModule*,VmPassType)::token),
     iVar4 != 0)) {
    RunVmPass::token = NULLC::TraceGetToken("InstructionTreeVm","RunVmPass");
    __cxa_guard_release(&RunVmPass(ExpressionContext&,VmModule*,VmPassType)::token);
  }
  ctx_00 = (ExpressionContext *)&stack0xffffffffffffffc0;
  NULLC::TraceScope::TraceScope((TraceScope *)ctx_00,RunVmPass::token);
  lVar2 = NULLC::traceContext;
  switch(type) {
  case VM_PASS_OPT_PEEPHOLE:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x15U) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x16) {
LAB_001a5948:
      __assert_fail("count < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x127,"void NULLC::TraceLabel(const char *)");
    }
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    builtin_strncpy((char *)(*(long *)(lVar2 + 0x268) + uVar5),"VM_PASS_OPT_PEEP",0x10);
    *(undefined8 *)(*(long *)(lVar2 + 0x268) + 0xd + uVar5) = 0x454c4f48504545;
    iVar4 = 0x15;
    break;
  case VM_PASS_OPT_CONSTANT_PROPAGATION:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x21U) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x22) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 0x10 + uVar5),"TANT_PROPAGATION",0x10);
    builtin_strncpy((char *)(lVar6 + uVar5),"VM_PASS_OPT_CONS",0x10);
    *(undefined1 *)(lVar6 + 0x20 + uVar5) = 0;
    iVar4 = 0x21;
    break;
  case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x22U) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x23) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 0x10 + uVar5),"_CODE_ELIMINATIO",0x10);
    builtin_strncpy((char *)(lVar6 + uVar5),"VM_PASS_OPT_DEAD",0x10);
    *(undefined2 *)(lVar6 + 0x20 + uVar5) = 0x4e;
    iVar4 = 0x22;
    break;
  case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x27U) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x28) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 0x10 + uVar5),"ROL_FLOW_SIPLIFI",0x10);
    builtin_strncpy((char *)(lVar6 + uVar5),"VM_PASS_OPT_CONT",0x10);
    *(undefined8 *)(lVar6 + 0x1f + uVar5) = 0x4e4f4954414349;
    iVar4 = 0x27;
    break;
  case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x23U) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x24) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 0x10 + uVar5),"_STORE_PROPAGATI",0x10);
    builtin_strncpy((char *)(lVar6 + uVar5),"VM_PASS_OPT_LOAD",0x10);
    *(undefined4 *)(lVar6 + 0x1f + uVar5) = 0x4e4f49;
    iVar4 = 0x23;
    break;
  case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x2dU) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x2e) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 0x1d + uVar5),"ION_ELIMINATION",0x10);
    builtin_strncpy((char *)(lVar6 + 0x10 + uVar5),"ON_SUBEXPRESSION",0x10);
    builtin_strncpy((char *)(lVar6 + uVar5),"VM_PASS_OPT_COMM",0x10);
    iVar4 = 0x2d;
    break;
  case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x2aU) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x2b) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 0x1a + uVar5),"ORE_ELIMINATION",0x10);
    builtin_strncpy((char *)(lVar6 + 0x10 + uVar5),"_ALLOCA_STORE_EL",0x10);
    builtin_strncpy((char *)(lVar6 + uVar5),"VM_PASS_OPT_DEAD",0x10);
    iVar4 = 0x2a;
    break;
  case VM_PASS_OPT_MEMORY_TO_REGISTER:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x1fU) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x20) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    builtin_strncpy((char *)(*(long *)(lVar2 + 0x268) + 0xf + uVar5),"ORY_TO_REGISTER",0x10);
    builtin_strncpy((char *)(*(long *)(lVar2 + 0x268) + uVar5),"VM_PASS_OPT_MEMO",0x10);
    iVar4 = 0x1f;
    break;
  case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x1eU) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x1f) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 0xe + uVar5),"RAY_TO_ELEMENTS",0x10);
    uVar9._0_1_ = 'O';
    uVar9._1_1_ = 'P';
    uVar9._2_1_ = 'T';
    uVar9._3_1_ = '_';
    uVar12._0_1_ = 'A';
    uVar12._1_1_ = 'R';
    uVar12._2_1_ = 'R';
    uVar12._3_1_ = 'A';
    goto LAB_001a5742;
  case VM_PASS_OPT_LATE_PEEPHOLE:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x1aU) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x1b) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 10 + uVar5),"T_LATE_PEEPHOLE",0x10);
    uVar8._0_1_ = 'O';
    uVar8._1_1_ = 'P';
    uVar8._2_1_ = 'T';
    uVar8._3_1_ = '_';
    uVar11._0_1_ = 'L';
    uVar11._1_1_ = 'A';
    uVar11._2_1_ = 'T';
    uVar11._3_1_ = 'E';
    goto LAB_001a5352;
  case VM_PASS_OPT_FUNCION_INLINING:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x1dU) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x1e) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    builtin_strncpy((char *)(*(long *)(lVar2 + 0x268) + 0xd + uVar5),"UNCION_INLINING",0x10);
    builtin_strncpy((char *)(*(long *)(lVar2 + 0x268) + uVar5),"VM_PASS_OPT_FUNC",0x10);
    iVar4 = 0x1d;
    break;
  case VM_PASS_UPDATE_LIVE_SETS:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x19U) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x1a) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 9 + uVar5),"PDATE_LIVE_SETS",0x10);
    uVar7._0_1_ = 'U';
    uVar7._1_1_ = 'P';
    uVar7._2_1_ = 'D';
    uVar7._3_1_ = 'A';
    uVar10._0_1_ = 'T';
    uVar10._1_1_ = 'E';
    uVar10._2_1_ = '_';
    uVar10._3_1_ = 'L';
    goto LAB_001a51e6;
  case VM_PASS_PREPARE_SSA_EXIT:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x19U) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x1a) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 9 + uVar5),"REPARE_SSA_EXIT",0x10);
    uVar7._0_1_ = 'P';
    uVar7._1_1_ = 'R';
    uVar7._2_1_ = 'E';
    uVar7._3_1_ = 'P';
    uVar10._0_1_ = 'A';
    uVar10._1_1_ = 'R';
    uVar10._2_1_ = 'E';
    uVar10._3_1_ = '_';
LAB_001a51e6:
    pcVar1 = (char *)(lVar6 + uVar5);
    pcVar1[0] = 'V';
    pcVar1[1] = 'M';
    pcVar1[2] = '_';
    pcVar1[3] = 'P';
    pcVar1[4] = 'A';
    pcVar1[5] = 'S';
    pcVar1[6] = 'S';
    pcVar1[7] = '_';
    *(undefined4 *)(pcVar1 + 8) = uVar7;
    *(undefined4 *)(pcVar1 + 0xc) = uVar10;
    iVar4 = 0x19;
    break;
  case VM_PASS_CREATE_ALLOCA_STORAGE:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x1eU) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x1f) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 0xe + uVar5),"_ALLOCA_STORAGE",0x10);
    uVar9._0_1_ = 'C';
    uVar9._1_1_ = 'R';
    uVar9._2_1_ = 'E';
    uVar9._3_1_ = 'A';
    uVar12._0_1_ = 'T';
    uVar12._1_1_ = 'E';
    uVar12._2_1_ = '_';
    uVar12._3_1_ = 'A';
    goto LAB_001a5742;
  case VM_PASS_LEGALIZE_ARRAY_VALUES:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x1eU) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x1f) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 0xe + uVar5),"ZE_ARRAY_VALUES",0x10);
    uVar9._0_1_ = 'L';
    uVar9._1_1_ = 'E';
    uVar9._2_1_ = 'G';
    uVar9._3_1_ = 'A';
    uVar12._0_1_ = 'L';
    uVar12._1_1_ = 'I';
    uVar12._2_1_ = 'Z';
    uVar12._3_1_ = 'E';
LAB_001a5742:
    pcVar1 = (char *)(lVar6 + uVar5);
    pcVar1[0] = 'V';
    pcVar1[1] = 'M';
    pcVar1[2] = '_';
    pcVar1[3] = 'P';
    pcVar1[4] = 'A';
    pcVar1[5] = 'S';
    pcVar1[6] = 'S';
    pcVar1[7] = '_';
    *(undefined4 *)(pcVar1 + 8) = uVar9;
    *(undefined4 *)(pcVar1 + 0xc) = uVar12;
    iVar4 = 0x1e;
    break;
  case VM_PASS_LEGALIZE_BITCASTS:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x1aU) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x1b) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 10 + uVar5),"GALIZE_BITCASTS",0x10);
    uVar8._0_1_ = 'L';
    uVar8._1_1_ = 'E';
    uVar8._2_1_ = 'G';
    uVar8._3_1_ = 'A';
    uVar11._0_1_ = 'L';
    uVar11._1_1_ = 'I';
    uVar11._2_1_ = 'Z';
    uVar11._3_1_ = 'E';
    goto LAB_001a5352;
  case VM_PASS_LEGALIZE_EXTRACTS:
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + 0x1aU) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 < 0x1b) goto LAB_001a5948;
    uVar5 = (ulong)*(uint *)(lVar2 + 0x260);
    lVar6 = *(long *)(lVar2 + 0x268);
    builtin_strncpy((char *)(lVar6 + 10 + uVar5),"GALIZE_EXTRACTS",0x10);
    uVar8._0_1_ = 'L';
    uVar8._1_1_ = 'E';
    uVar8._2_1_ = 'G';
    uVar8._3_1_ = 'A';
    uVar11._0_1_ = 'L';
    uVar11._1_1_ = 'I';
    uVar11._2_1_ = 'Z';
    uVar11._3_1_ = 'E';
LAB_001a5352:
    pcVar1 = (char *)(lVar6 + uVar5);
    pcVar1[0] = 'V';
    pcVar1[1] = 'M';
    pcVar1[2] = '_';
    pcVar1[3] = 'P';
    pcVar1[4] = 'A';
    pcVar1[5] = 'S';
    pcVar1[6] = 'S';
    pcVar1[7] = '_';
    *(undefined4 *)(pcVar1 + 8) = uVar8;
    *(undefined4 *)(pcVar1 + 0xc) = uVar11;
    iVar4 = 0x1a;
    break;
  default:
    goto switchD_001a4f26_default;
  }
  *(int *)(lVar2 + 0x260) = *(int *)(lVar2 + 0x260) + iVar4;
  lVar6 = *(long *)(lVar2 + 0x278);
  uVar3 = *(uint *)(lVar2 + 0x270);
  *(uint *)(lVar2 + 0x270) = uVar3 + 1;
  *(int *)(lVar6 + (ulong)uVar3 * 8) = (int)uVar5 * 4 + 2;
  *(undefined4 *)(lVar6 + 4 + (ulong)uVar3 * 8) = 0;
switchD_001a4f26_default:
  for (function = (ExpressionContext *)(module->functions).head;
      function != (ExpressionContext *)0x0;
      function = (ExpressionContext *)(function->uniqueDependencies).little[0x14]) {
    if ((function->uniqueDependencies).little[0x11] != (ModuleData *)0x0) {
      switch(type) {
      case VM_PASS_OPT_PEEPHOLE:
        RunPeepholeOptimizations(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_OPT_CONSTANT_PROPAGATION:
        RunConstantPropagation(ctx,module,(VmValue *)function,false);
        break;
      case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
        RunDeadCodeElimiation(ctx,module,(VmFunction *)function);
        break;
      case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
        RunControlFlowOptimization(ctx_00,module,(VmValue *)function);
        break;
      case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
        RunLoadStorePropagation(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
        RunCommonSubexpressionElimination(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
        RunDeadAlocaStoreElimination(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_OPT_MEMORY_TO_REGISTER:
        RunMemoryToRegister(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
        RunArrayToElements(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_OPT_LATE_PEEPHOLE:
        RunLatePeepholeOptimizations(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_OPT_FUNCION_INLINING:
        RunFunctionInlining(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_UPDATE_LIVE_SETS:
        RunUpdateLiveSets(ctx_00,module,(VmValue *)function);
        break;
      case VM_PASS_PREPARE_SSA_EXIT:
        RunPrepareSsaExit(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_CREATE_ALLOCA_STORAGE:
        RunCreateAllocaStorage(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_LEGALIZE_ARRAY_VALUES:
        RunLegalizeArrayValues(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_LEGALIZE_BITCASTS:
        RunLegalizeBitcasts(ctx,module,(VmValue *)function);
        break;
      case VM_PASS_LEGALIZE_EXTRACTS:
        RunLegalizeExtracts(ctx,module,(VmValue *)function);
      }
      ctx_00 = function;
      VmFunction::MoveEntryBlockToStart((VmFunction *)function);
    }
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void RunVmPass(ExpressionContext &ctx, VmModule *module, VmPassType type)
{
	TRACE_SCOPE("InstructionTreeVm", "RunVmPass");

	switch(type)
	{
	case VM_PASS_OPT_PEEPHOLE:
		TRACE_LABEL("VM_PASS_OPT_PEEPHOLE");
		break;
	case VM_PASS_OPT_CONSTANT_PROPAGATION:
		TRACE_LABEL("VM_PASS_OPT_CONSTANT_PROPAGATION");
		break;
	case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
		TRACE_LABEL("VM_PASS_OPT_DEAD_CODE_ELIMINATION");
		break;
	case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
		TRACE_LABEL("VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION");
		break;
	case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
		TRACE_LABEL("VM_PASS_OPT_LOAD_STORE_PROPAGATION");
		break;
	case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
		TRACE_LABEL("VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION");
		break;
	case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
		TRACE_LABEL("VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION");
		break;
	case VM_PASS_OPT_MEMORY_TO_REGISTER:
		TRACE_LABEL("VM_PASS_OPT_MEMORY_TO_REGISTER");
		break;
	case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
		TRACE_LABEL("VM_PASS_OPT_ARRAY_TO_ELEMENTS");
		break;
	case VM_PASS_OPT_LATE_PEEPHOLE:
		TRACE_LABEL("VM_PASS_OPT_LATE_PEEPHOLE");
		break;
	case VM_PASS_OPT_FUNCION_INLINING:
		TRACE_LABEL("VM_PASS_OPT_FUNCION_INLINING");
		break;
	case VM_PASS_UPDATE_LIVE_SETS:
		TRACE_LABEL("VM_PASS_UPDATE_LIVE_SETS");
		break;
	case VM_PASS_PREPARE_SSA_EXIT:
		TRACE_LABEL("VM_PASS_PREPARE_SSA_EXIT");
		break;
	case VM_PASS_CREATE_ALLOCA_STORAGE:
		TRACE_LABEL("VM_PASS_CREATE_ALLOCA_STORAGE");
		break;
	case VM_PASS_LEGALIZE_ARRAY_VALUES:
		TRACE_LABEL("VM_PASS_LEGALIZE_ARRAY_VALUES");
		break;
	case VM_PASS_LEGALIZE_BITCASTS:
		TRACE_LABEL("VM_PASS_LEGALIZE_BITCASTS");
		break;
	case VM_PASS_LEGALIZE_EXTRACTS:
		TRACE_LABEL("VM_PASS_LEGALIZE_EXTRACTS");
		break;
	}

	for(VmFunction *value = module->functions.head; value; value = value->next)
	{
		if(!value->firstBlock)
			continue;

		switch(type)
		{
		case VM_PASS_OPT_PEEPHOLE:
			RunPeepholeOptimizations(ctx, module, value);
			break;
		case VM_PASS_OPT_CONSTANT_PROPAGATION:
			RunConstantPropagation(ctx, module, value, false);
			break;
		case VM_PASS_OPT_DEAD_CODE_ELIMINATION:
			RunDeadCodeElimiation(ctx, module, value);
			break;
		case VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION:
			RunControlFlowOptimization(ctx, module, value);
			break;
		case VM_PASS_OPT_LOAD_STORE_PROPAGATION:
			RunLoadStorePropagation(ctx, module, value);
			break;
		case VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION:
			RunCommonSubexpressionElimination(ctx, module, value);
			break;
		case VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION:
			RunDeadAlocaStoreElimination(ctx, module, value);
			break;
		case VM_PASS_OPT_MEMORY_TO_REGISTER:
			RunMemoryToRegister(ctx, module, value);
			break;
		case VM_PASS_OPT_ARRAY_TO_ELEMENTS:
			RunArrayToElements(ctx, module, value);
			break;
		case VM_PASS_OPT_LATE_PEEPHOLE:
			RunLatePeepholeOptimizations(ctx, module, value);
			break;
		case VM_PASS_OPT_FUNCION_INLINING:
			RunFunctionInlining(ctx, module, value);
			break;
		case VM_PASS_UPDATE_LIVE_SETS:
			RunUpdateLiveSets(ctx, module, value);
			break;
		case VM_PASS_PREPARE_SSA_EXIT:
			RunPrepareSsaExit(ctx, module, value);
			break;
		case VM_PASS_CREATE_ALLOCA_STORAGE:
			RunCreateAllocaStorage(ctx, module, value);
			break;
		case VM_PASS_LEGALIZE_ARRAY_VALUES:
			RunLegalizeArrayValues(ctx, module, value);
			break;
		case VM_PASS_LEGALIZE_BITCASTS:
			RunLegalizeBitcasts(ctx, module, value);
			break;
		case VM_PASS_LEGALIZE_EXTRACTS:
			RunLegalizeExtracts(ctx, module, value);
			break;
		}

		// Preserve entry block order for execution
		value->MoveEntryBlockToStart();
	}
}